

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias.cpp
# Opt level: O1

int __thiscall ncnn::Bias::load_model(Bias *this,ModelBin *mb)

{
  Mat *pMVar1;
  int *piVar2;
  void *__ptr;
  Allocator *pAVar3;
  int iVar4;
  void *local_68;
  int *piStack_60;
  size_t local_58;
  int local_50;
  Allocator *local_48;
  int local_40;
  int iStack_3c;
  int iStack_38;
  int iStack_34;
  int local_30;
  size_t local_28;
  
  (*mb->_vptr_ModelBin[2])(&local_68,mb,(ulong)(uint)this->bias_data_size);
  pMVar1 = &this->bias_data;
  if (pMVar1 != (Mat *)&local_68) {
    if (piStack_60 != (int *)0x0) {
      LOCK();
      *piStack_60 = *piStack_60 + 1;
      UNLOCK();
    }
    piVar2 = (this->bias_data).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        __ptr = (this->bias_data).data;
        pAVar3 = (this->bias_data).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (*pAVar3->_vptr_Allocator[3])();
        }
      }
    }
    (this->bias_data).cstep = 0;
    *(undefined8 *)((long)&(this->bias_data).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->bias_data).elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (this->bias_data).refcount = (int *)0x0;
    (this->bias_data).dims = 0;
    (this->bias_data).w = 0;
    (this->bias_data).h = 0;
    (this->bias_data).d = 0;
    (this->bias_data).c = 0;
    (this->bias_data).data = local_68;
    (this->bias_data).refcount = piStack_60;
    (this->bias_data).elemsize = local_58;
    (this->bias_data).elempack = local_50;
    (this->bias_data).allocator = local_48;
    (this->bias_data).dims = local_40;
    (this->bias_data).w = iStack_3c;
    (this->bias_data).h = iStack_38;
    (this->bias_data).d = iStack_34;
    (this->bias_data).c = local_30;
    (this->bias_data).cstep = local_28;
  }
  if (piStack_60 != (int *)0x0) {
    LOCK();
    *piStack_60 = *piStack_60 + -1;
    UNLOCK();
    if (*piStack_60 == 0) {
      if (local_48 == (Allocator *)0x0) {
        if (local_68 != (void *)0x0) {
          free(local_68);
        }
      }
      else {
        (*local_48->_vptr_Allocator[3])();
      }
    }
  }
  if (pMVar1->data == (void *)0x0) {
    iVar4 = -100;
  }
  else {
    iVar4 = -100;
    if ((long)(this->bias_data).c * (this->bias_data).cstep != 0) {
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int Bias::load_model(const ModelBin& mb)
{
    bias_data = mb.load(bias_data_size, 1);
    if (bias_data.empty())
        return -100;

    return 0;
}